

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O2

SetScope duckdb::anon_unknown_423::ToSetScope(VariableSetScope pg_scope)

{
  InternalException *this;
  allocator local_41;
  string local_40;
  
  if (pg_scope < (VAR_SET_SCOPE_DEFAULT|VAR_SET_SCOPE_SESSION)) {
    return (SetScope)(0x4030201L >> ((byte)(pg_scope << 3) & 0x3f));
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"Unexpected pg_scope: %d",&local_41);
  InternalException::InternalException<duckdb_libpgquery::VariableSetScope>(this,&local_40,pg_scope)
  ;
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SetScope ToSetScope(duckdb_libpgquery::VariableSetScope pg_scope) {
	switch (pg_scope) {
	case duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_LOCAL:
		return SetScope::LOCAL;
	case duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_SESSION:
		return SetScope::SESSION;
	case duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_GLOBAL:
		return SetScope::GLOBAL;
	case duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_VARIABLE:
		return SetScope::VARIABLE;
	case duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_DEFAULT:
		return SetScope::AUTOMATIC;
	default:
		throw InternalException("Unexpected pg_scope: %d", pg_scope);
	}
}